

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanUploadHeap.cpp
# Opt level: O0

void __thiscall
Diligent::VulkanUploadHeap::VulkanUploadHeap
          (VulkanUploadHeap *this,RenderDeviceVkImpl *RenderDevice,string *HeapName,
          VkDeviceSize PageSize)

{
  VkDeviceSize PageSize_local;
  string *HeapName_local;
  RenderDeviceVkImpl *RenderDevice_local;
  VulkanUploadHeap *this_local;
  
  this->m_RenderDevice = RenderDevice;
  std::__cxx11::string::string((string *)&this->m_HeapName,(string *)HeapName);
  this->m_PageSize = PageSize;
  std::
  vector<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  ::vector(&this->m_Pages);
  CurrPageInfo::CurrPageInfo(&this->m_CurrPage);
  this->m_CurrFrameSize = 0;
  this->m_PeakFrameSize = 0;
  this->m_CurrAllocatedSize = 0;
  this->m_PeakAllocatedSize = 0;
  return;
}

Assistant:

VulkanUploadHeap::VulkanUploadHeap(RenderDeviceVkImpl& RenderDevice,
                                   std::string         HeapName,
                                   VkDeviceSize        PageSize) :
    // clang-format off
    m_RenderDevice {RenderDevice       },
    m_HeapName     {std::move(HeapName)},
    m_PageSize     {PageSize           }
// clang-format on
{
}